

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_uint nk_tt__find_table(nk_byte *data,nk_uint fontstart,char *tag)

{
  uint uVar1;
  ushort uVar2;
  long lVar3;
  undefined4 in_register_00000034;
  
  uVar2 = *(ushort *)(data + 4) << 8 | *(ushort *)(data + 4) >> 8;
  if (uVar2 != 0) {
    lVar3 = 0;
    do {
      if (((((uint)data[lVar3 + 0xc] == (int)*(char *)CONCAT44(in_register_00000034,fontstart)) &&
           ((uint)data[lVar3 + 0xd] == (int)*(char *)(CONCAT44(in_register_00000034,fontstart) + 1))
           ) && ((uint)data[lVar3 + 0xe] ==
                 (int)*(char *)(CONCAT44(in_register_00000034,fontstart) + 2))) &&
         ((uint)data[lVar3 + 0xf] == (int)*(char *)(CONCAT44(in_register_00000034,fontstart) + 3)))
      {
        uVar1 = *(uint *)(data + lVar3 + 0x14);
        return uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      }
      lVar3 = lVar3 + 0x10;
    } while ((ulong)uVar2 * 0x10 != lVar3);
  }
  return 0;
}

Assistant:

NK_INTERN nk_uint
nk_tt__find_table(const nk_byte *data, nk_uint fontstart, const char *tag)
{
    /* @OPTIMIZE: binary search */
    nk_int num_tables = nk_ttUSHORT(data+fontstart+4);
    nk_uint tabledir = fontstart + 12;
    nk_int i;
    for (i = 0; i < num_tables; ++i) {
        nk_uint loc = tabledir + (nk_uint)(16*i);
        if (nk_tt_tag(data+loc+0, tag))
            return nk_ttULONG(data+loc+8);
    }
    return 0;
}